

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_integer(void)

{
  XSValue_Data actValue;
  XSValue_Data actValue_00;
  XSValue_Data actValue_01;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  byte bVar1;
  bool bVar2;
  XMLCh *pXVar3;
  char *pcVar4;
  XSValue *pXVar5;
  char *pcVar6;
  char *pcVar7;
  wchar16 *pwVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_818;
  StrX local_808;
  StrX local_7f8;
  long local_7e8;
  XMLCh *actRetCanRep_7;
  undefined1 local_7d8 [4];
  Status myStatus_21;
  StrX local_7c8;
  StrX local_7b8;
  long local_7a8;
  XMLCh *actRetCanRep_6;
  undefined1 local_798 [4];
  Status myStatus_20;
  StrX local_788;
  char *local_778;
  char *actRetCanRep_inchar_5;
  wchar16 *local_760;
  XMLCh *actRetCanRep_5;
  undefined1 local_750 [4];
  Status myStatus_19;
  StrX local_740;
  char *local_730;
  char *actRetCanRep_inchar_4;
  wchar16 *local_718;
  XMLCh *actRetCanRep_4;
  undefined1 local_708 [4];
  Status myStatus_18;
  StrX local_6f8;
  char *local_6e8;
  char *actRetCanRep_inchar_3;
  wchar16 *local_6d0;
  XMLCh *actRetCanRep_3;
  undefined1 local_6c0 [4];
  Status myStatus_17;
  StrX local_6b0;
  char *local_6a0;
  char *actRetCanRep_inchar_2;
  wchar16 *local_688;
  XMLCh *actRetCanRep_2;
  undefined1 local_678 [4];
  Status myStatus_16;
  StrX local_668;
  char *local_658;
  char *actRetCanRep_inchar_1;
  wchar16 *local_640;
  XMLCh *actRetCanRep_1;
  undefined1 local_630 [4];
  Status myStatus_15;
  StrX local_620;
  char *local_610;
  char *actRetCanRep_inchar;
  wchar16 *local_5f8;
  XMLCh *actRetCanRep;
  Status myStatus_14;
  int j;
  StrX local_5d8;
  StrX local_5c8;
  XSValue *local_5b8;
  XSValue *actRetValue_6;
  undefined1 local_5a8 [4];
  Status myStatus_13;
  StrX local_598;
  StrX local_588;
  XSValue *local_578;
  XSValue *actRetValue_5;
  undefined1 local_568 [4];
  Status myStatus_12;
  StrX local_558;
  StrX local_548;
  XSValue *local_538;
  XSValue *actRetValue_4;
  undefined1 local_528 [4];
  Status myStatus_11;
  StrX local_518;
  StrX local_508;
  XSValue *local_4f8;
  XSValue *actRetValue_3;
  undefined1 local_4e8 [4];
  Status myStatus_10;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  StrX local_488;
  XSValue *local_478;
  XSValue *actRetValue_2;
  undefined1 local_468 [4];
  Status myStatus_9;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  StrX local_408;
  XSValue *local_3f8;
  XSValue *actRetValue_1;
  undefined1 local_3e8 [4];
  Status myStatus_8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  StrX local_388;
  XSValue *local_378;
  XSValue *actRetValue;
  Status myStatus_7;
  int i;
  StrX local_358;
  StrX local_348;
  byte local_335;
  Status local_334;
  undefined1 local_330 [3];
  bool actRetValid_6;
  Status myStatus_6;
  StrX local_320;
  StrX local_310;
  byte local_2fd;
  Status local_2fc;
  undefined1 local_2f8 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_2e8;
  byte local_2d5;
  Status local_2d4;
  undefined1 local_2d0 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_2c0;
  byte local_2ad;
  Status local_2ac;
  undefined1 local_2a8 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_298;
  byte local_285;
  Status local_284;
  undefined1 local_280 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_270;
  byte local_25d;
  Status local_25c;
  undefined1 local_258 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_238;
  byte local_225;
  Status local_224;
  char acStack_220 [3];
  bool actRetValid;
  Status myStatus;
  char data_canrep_2 [6];
  char data_rawstr_2 [9];
  char data_canrep_1 [6];
  char data_rawstr_1 [14];
  char lex_iv_2 [8];
  char lex_iv_1 [10];
  char lex_v_ran64_iv_2_canrep [21];
  char acStack_1b8 [8];
  char lex_v_ran64_iv_1_canrep [20];
  char acStack_198 [8];
  char lex_v_ran64_v_2_canrep [21];
  char acStack_178 [8];
  char lex_v_ran64_v_1_canrep [20];
  XSValue_Data act_v_ran32_v_2;
  XSValue_Data act_v_ran32_v_1;
  XSValue_Data act_v_ran64_v_2;
  XSValue_Data act_v_ran64_v_1;
  XSValue_Data act_v_ran_v_1;
  char lex_v_ran64_iv_2 [21];
  char acStack_78 [8];
  char lex_v_ran64_iv_1 [21];
  char acStack_58 [8];
  char lex_v_ran64_v_2 [21];
  char acStack_38 [8];
  char lex_v_ran64_v_1 [21];
  char lex_v_ran_v_1 [13];
  bool toValidate;
  DataType dt;
  
  builtin_strncpy(lex_v_ran64_v_1 + 0x10,"   12",5);
  builtin_strncpy(lex_v_ran64_v_1 + 8,"5807",5);
  builtin_strncpy(acStack_38,"+9223372",8);
  builtin_strncpy(lex_v_ran64_v_1,"03685477",8);
  builtin_strncpy(lex_v_ran64_v_2 + 8,"5808",5);
  builtin_strncpy(acStack_58,"-9223372",8);
  builtin_strncpy(lex_v_ran64_v_2,"03685477",8);
  builtin_strncpy(lex_v_ran64_iv_1 + 8,"5808",5);
  builtin_strncpy(acStack_78,"+9223372",8);
  builtin_strncpy(lex_v_ran64_iv_1,"03685477",8);
  act_v_ran_v_1.fValue.f_datetime.f_milisec = 8.60535824740188e-67;
  act_v_ran_v_1.f_datatype = 0x4d2;
  act_v_ran_v_1._4_4_ = 0;
  act_v_ran64_v_1.f_datatype = ~dt_string;
  act_v_ran64_v_1._4_4_ = 0x7fffffff;
  act_v_ran64_v_2.f_datatype = dt_string;
  act_v_ran64_v_2._4_4_ = 0x80000000;
  act_v_ran32_v_1.f_datatype = 0x7fffffff;
  act_v_ran32_v_1._4_4_ = 0;
  builtin_strncpy(acStack_178,"92233720",8);
  builtin_strncpy(lex_v_ran64_v_1_canrep,"36854775807",0xc);
  builtin_strncpy(lex_v_ran64_v_2_canrep + 8,"5808",5);
  builtin_strncpy(acStack_198,"-9223372",8);
  builtin_strncpy(lex_v_ran64_v_2_canrep,"03685477",8);
  builtin_strncpy(acStack_1b8,"92233720",8);
  builtin_strncpy(lex_v_ran64_iv_1_canrep,"36854775808",0xc);
  stack0xfffffffffffffe28 = 0x323733333232392d;
  builtin_strncpy(lex_iv_2,"12b34.45",8);
  lex_iv_1[0] = '6';
  lex_iv_1[1] = '\0';
  stack0xfffffffffffffe10 = 0x36356234333231;
  data_rawstr_1[0] = '5';
  data_rawstr_1[1] = ' ';
  data_rawstr_1[2] = ' ';
  data_rawstr_1[3] = ' ';
  data_rawstr_1[4] = '\n';
  data_rawstr_1[5] = '\0';
  builtin_strncpy(data_canrep_1,"   +12",6);
  stack0xfffffffffffffdf8 = 0x34333231;
  _data_canrep_2 = 0x3534333231303030;
  data_rawstr_2[0] = '\0';
  myStatus._0_2_ = 0x35;
  _acStack_220 = 0x34333231;
  local_224 = st_Init;
  StrX::StrX(&local_238,lex_v_ran64_v_1 + 0x10);
  pXVar3 = StrX::unicodeForm(&local_238);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_integer,&local_224,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_238);
  local_225 = bVar1 & 1;
  if (local_225 != 1) {
    pXVar3 = getDataTypeString(dt_integer);
    StrX::StrX((StrX *)local_258,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_258);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x557,lex_v_ran64_v_1 + 0x10,pcVar4,1);
    StrX::~StrX((StrX *)local_258);
    errSeen = true;
  }
  local_25c = st_Init;
  StrX::StrX(&local_270,acStack_38);
  pXVar3 = StrX::unicodeForm(&local_270);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_integer,&local_25c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_270);
  local_25d = bVar1 & 1;
  if (local_25d != 1) {
    pXVar3 = getDataTypeString(dt_integer);
    StrX::StrX((StrX *)local_280,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_280);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x558,acStack_38,pcVar4,1);
    StrX::~StrX((StrX *)local_280);
    errSeen = true;
  }
  local_284 = st_Init;
  StrX::StrX(&local_298,acStack_58);
  pXVar3 = StrX::unicodeForm(&local_298);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_integer,&local_284,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_298);
  local_285 = bVar1 & 1;
  if (local_285 != 1) {
    pXVar3 = getDataTypeString(dt_integer);
    StrX::StrX((StrX *)local_2a8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_2a8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x559,acStack_58,pcVar4,1);
    StrX::~StrX((StrX *)local_2a8);
    errSeen = true;
  }
  local_2ac = st_Init;
  StrX::StrX(&local_2c0,acStack_78);
  pXVar3 = StrX::unicodeForm(&local_2c0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_integer,&local_2ac,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_2c0);
  local_2ad = bVar1 & 1;
  if (local_2ad != 1) {
    pXVar3 = getDataTypeString(dt_integer);
    StrX::StrX((StrX *)local_2d0,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_2d0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55a,acStack_78,pcVar4,1);
    StrX::~StrX((StrX *)local_2d0);
    errSeen = true;
  }
  local_2d4 = st_Init;
  StrX::StrX(&local_2e8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar3 = StrX::unicodeForm(&local_2e8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_integer,&local_2d4,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_2e8);
  local_2d5 = bVar1 & 1;
  if (local_2d5 != 1) {
    pXVar3 = getDataTypeString(dt_integer);
    StrX::StrX((StrX *)local_2f8,pXVar3);
    pcVar4 = StrX::localForm((StrX *)local_2f8);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55b,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,1);
    StrX::~StrX((StrX *)local_2f8);
    errSeen = true;
  }
  local_2fc = st_Init;
  StrX::StrX(&local_310,lex_iv_2);
  pXVar3 = StrX::unicodeForm(&local_310);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_integer,&local_2fc,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_310);
  local_2fd = bVar1 & 1;
  if (local_2fd == 0) {
    if (local_2fc != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_330,pXVar3);
      pcVar4 = StrX::localForm((StrX *)local_330);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_2fc);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x55e,lex_iv_2,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)local_330);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_integer);
    StrX::StrX(&local_320,pXVar3);
    pcVar4 = StrX::localForm(&local_320);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55e,lex_iv_2,pcVar4,0);
    StrX::~StrX(&local_320);
    errSeen = true;
  }
  local_334 = st_Init;
  StrX::StrX(&local_348,data_rawstr_1 + 8);
  pXVar3 = StrX::unicodeForm(&local_348);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar3,dt_integer,&local_334,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_348);
  local_335 = bVar1 & 1;
  if (local_335 == 0) {
    if (local_334 != st_FOCA0002) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)&myStatus_7,pXVar3);
      pcVar4 = StrX::localForm((StrX *)&myStatus_7);
      pcVar6 = getStatusString(st_FOCA0002);
      pcVar7 = getStatusString(local_334);
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x55f,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
      StrX::~StrX((StrX *)&myStatus_7);
      errSeen = true;
    }
  }
  else {
    pXVar3 = getDataTypeString(dt_integer);
    StrX::StrX(&local_358,pXVar3);
    pcVar4 = StrX::localForm(&local_358);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x55f,data_rawstr_1 + 8,pcVar4,0);
    StrX::~StrX(&local_358);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = 0;
    StrX::StrX(&local_388,lex_v_ran64_v_1 + 0x10);
    pXVar3 = StrX::unicodeForm(&local_388);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_integer,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_388);
    local_378 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_3e8,pXVar3);
      StrX::localForm((StrX *)local_3e8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57c,lex_v_ran64_v_1 + 0x10);
      StrX::~StrX((StrX *)local_3e8);
      errSeen = true;
    }
    else {
      memcpy(&local_3b0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran64_v_1.fValue + 0x18);
      memcpy(&local_3d8,pvVar10,0x28);
      actValue.fValue.f_long = uStack_3a8;
      actValue._0_8_ = local_3b0;
      actValue.fValue._8_8_ = local_3a0;
      actValue.fValue._16_8_ = uStack_398;
      actValue.fValue.f_datetime.f_milisec = (double)local_390;
      expValue.fValue.f_long = uStack_3d0;
      expValue._0_8_ = local_3d8;
      expValue.fValue._8_8_ = local_3c8;
      expValue.fValue._16_8_ = uStack_3c0;
      expValue.fValue.f_datetime.f_milisec = (double)local_3b8;
      bVar2 = compareActualValue(dt_integer,actValue,expValue);
      pXVar5 = local_378;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_378 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_378);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_1._4_4_ = 0;
    StrX::StrX(&local_408,acStack_38);
    pXVar3 = StrX::unicodeForm(&local_408);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_integer,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_408);
    local_3f8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_468,pXVar3);
      StrX::localForm((StrX *)local_468);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57e,acStack_38);
      StrX::~StrX((StrX *)local_468);
      errSeen = true;
    }
    else {
      memcpy(&local_430,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran64_v_2.fValue + 0x18);
      memcpy(&local_458,pvVar10,0x28);
      actValue_00.fValue.f_long = uStack_428;
      actValue_00._0_8_ = local_430;
      actValue_00.fValue._8_8_ = local_420;
      actValue_00.fValue._16_8_ = uStack_418;
      actValue_00.fValue.f_datetime.f_milisec = (double)local_410;
      expValue_00.fValue.f_long = uStack_450;
      expValue_00._0_8_ = local_458;
      expValue_00.fValue._8_8_ = local_448;
      expValue_00.fValue._16_8_ = uStack_440;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_438;
      bVar2 = compareActualValue(dt_integer,actValue_00,expValue_00);
      pXVar5 = local_3f8;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_3f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_3f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_2._4_4_ = 0;
    StrX::StrX(&local_488,acStack_58);
    pXVar3 = StrX::unicodeForm(&local_488);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_integer,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_488);
    local_478 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_4e8,pXVar3);
      StrX::localForm((StrX *)local_4e8);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x57f,acStack_58);
      StrX::~StrX((StrX *)local_4e8);
      errSeen = true;
    }
    else {
      memcpy(&local_4b0,pXVar5,0x28);
      pvVar10 = (void *)((long)&act_v_ran32_v_1.fValue + 0x18);
      memcpy(&local_4d8,pvVar10,0x28);
      actValue_01.fValue.f_long = uStack_4a8;
      actValue_01._0_8_ = local_4b0;
      actValue_01.fValue._8_8_ = local_4a0;
      actValue_01.fValue._16_8_ = uStack_498;
      actValue_01.fValue.f_datetime.f_milisec = (double)local_490;
      expValue_01.fValue.f_long = uStack_4d0;
      expValue_01._0_8_ = local_4d8;
      expValue_01.fValue._8_8_ = local_4c8;
      expValue_01.fValue._16_8_ = uStack_4c0;
      expValue_01.fValue.f_datetime.f_milisec = (double)local_4b8;
      bVar2 = compareActualValue(dt_integer,actValue_01,expValue_01);
      pXVar5 = local_478;
      if (!bVar2) {
        errSeen = true;
      }
      if (local_478 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_478);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_508,acStack_78);
    pXVar3 = StrX::unicodeForm(&local_508);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_integer,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_508);
    local_4f8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_3._4_4_ != st_FOCA0003) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX((StrX *)local_528,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_528);
        pcVar6 = getStatusString(st_FOCA0003);
        pcVar7 = getStatusString(actRetValue_3._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x580,acStack_78,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_528);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX(&local_518,pXVar3);
      StrX::localForm(&local_518);
      pvVar10 = (void *)0x580;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x580,acStack_78);
      StrX::~StrX(&local_518);
      pXVar5 = local_4f8;
      errSeen = true;
      if (local_4f8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_4f8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_548,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm(&local_548);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_integer,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_548);
    local_538 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_4._4_4_ != st_FOCA0003) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX((StrX *)local_568,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_568);
        pcVar6 = getStatusString(st_FOCA0003);
        pcVar7 = getStatusString(actRetValue_4._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x581,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_568);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX(&local_558,pXVar3);
      StrX::localForm(&local_558);
      pvVar10 = (void *)0x581;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x581,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_558);
      pXVar5 = local_538;
      errSeen = true;
      if (local_538 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_538);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_588,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_588);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_integer,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_588);
    local_578 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_5._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX((StrX *)local_5a8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_5a8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_5._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x583,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_5a8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX(&local_598,pXVar3);
      StrX::localForm(&local_598);
      pvVar10 = (void *)0x583;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x583,lex_iv_2);
      StrX::~StrX(&local_598);
      pXVar5 = local_578;
      errSeen = true;
      if (local_578 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_578);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
    actRetValue_6._4_4_ = st_Init;
    StrX::StrX(&local_5c8,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_5c8);
    pXVar5 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar3,dt_integer,(Status *)((long)&actRetValue_6 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_5c8);
    local_5b8 = pXVar5;
    if (pXVar5 == (XSValue *)0x0) {
      if (actRetValue_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX((StrX *)&myStatus_14,pXVar3);
        pcVar4 = StrX::localForm((StrX *)&myStatus_14);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetValue_6._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x584,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)&myStatus_14);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX(&local_5d8,pXVar3);
      StrX::localForm(&local_5d8);
      pvVar10 = (void *)0x584;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x584,data_rawstr_1 + 8);
      StrX::~StrX(&local_5d8);
      pXVar5 = local_5b8;
      errSeen = true;
      if (local_5b8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_5b8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar,data_canrep_1);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_integer,(Status *)&actRetCanRep,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar);
    local_5f8 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_630,pXVar3);
      StrX::localForm((StrX *)local_630);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a2,data_canrep_1);
      StrX::~StrX((StrX *)local_630);
      errSeen = true;
    }
    else {
      local_610 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_610,data_rawstr_2 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX(&local_620,pXVar3);
        pcVar4 = StrX::localForm(&local_620);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a2,data_canrep_1,pcVar4,local_610,data_rawstr_2 + 8);
        StrX::~StrX(&local_620);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_5f8);
      xercesc_4_0::XMLString::release(&local_610,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_1._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_1,data_canrep_2);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_1);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_integer,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_1);
    local_640 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_678,pXVar3);
      StrX::localForm((StrX *)local_678);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a3,data_canrep_2);
      StrX::~StrX((StrX *)local_678);
      errSeen = true;
    }
    else {
      local_658 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_658,acStack_220);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX(&local_668,pXVar3);
        pcVar4 = StrX::localForm(&local_668);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a3,data_canrep_2,pcVar4,local_658,acStack_220);
        StrX::~StrX(&local_668);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_640);
      xercesc_4_0::XMLString::release(&local_658,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_2._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_2,acStack_38);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_2);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_integer,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_2);
    local_688 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_6c0,pXVar3);
      StrX::localForm((StrX *)local_6c0);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a5,acStack_38);
      StrX::~StrX((StrX *)local_6c0);
      errSeen = true;
    }
    else {
      local_6a0 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_6a0,acStack_178);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX(&local_6b0,pXVar3);
        pcVar4 = StrX::localForm(&local_6b0);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a5,acStack_38,pcVar4,local_6a0,acStack_178);
        StrX::~StrX(&local_6b0);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_688);
      xercesc_4_0::XMLString::release(&local_6a0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_3._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_3,acStack_58);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_3);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_integer,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_3);
    local_6d0 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_708,pXVar3);
      StrX::localForm((StrX *)local_708);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a6,acStack_58);
      StrX::~StrX((StrX *)local_708);
      errSeen = true;
    }
    else {
      local_6e8 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_6e8,acStack_198);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX(&local_6f8,pXVar3);
        pcVar4 = StrX::localForm(&local_6f8);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a6,acStack_58,pcVar4,local_6e8,acStack_198);
        StrX::~StrX(&local_6f8);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_6d0);
      xercesc_4_0::XMLString::release(&local_6e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_4._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_4,acStack_78);
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_4);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_integer,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_4);
    local_718 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_750,pXVar3);
      StrX::localForm((StrX *)local_750);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a7,acStack_78);
      StrX::~StrX((StrX *)local_750);
      errSeen = true;
    }
    else {
      local_730 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_730,acStack_1b8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX(&local_740,pXVar3);
        pcVar4 = StrX::localForm(&local_740);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a7,acStack_78,pcVar4,local_730,acStack_1b8);
        StrX::~StrX(&local_740);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_718);
      xercesc_4_0::XMLString::release(&local_730,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_5._4_4_ = 0;
    StrX::StrX((StrX *)&actRetCanRep_inchar_5,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar3 = StrX::unicodeForm((StrX *)&actRetCanRep_inchar_5);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (pXVar3,dt_integer,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX((StrX *)&actRetCanRep_inchar_5);
    local_760 = pwVar8;
    if (pwVar8 == (wchar16 *)0x0) {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX((StrX *)local_798,pXVar3);
      StrX::localForm((StrX *)local_798);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a8,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX((StrX *)local_798);
      errSeen = true;
    }
    else {
      local_778 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      bVar2 = xercesc_4_0::XMLString::equals(local_778,lex_iv_1 + 8);
      if (!bVar2) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX(&local_788,pXVar3);
        pcVar4 = StrX::localForm(&local_788);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x5a8,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar4,local_778,
               lex_iv_1 + 8);
        StrX::~StrX(&local_788);
        errSeen = true;
      }
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_760);
      xercesc_4_0::XMLString::release(&local_778,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    actRetCanRep_6._4_4_ = st_Init;
    StrX::StrX(&local_7b8,lex_iv_2);
    pXVar3 = StrX::unicodeForm(&local_7b8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_integer,(Status *)((long)&actRetCanRep_6 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_7b8);
    local_7a8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_6._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX((StrX *)local_7d8,pXVar3);
        pcVar4 = StrX::localForm((StrX *)local_7d8);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_6._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x5a9,lex_iv_2,pcVar4,pcVar6,pcVar7);
        StrX::~StrX((StrX *)local_7d8);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX(&local_7c8,pXVar3);
      StrX::localForm(&local_7c8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5a9,lex_iv_2);
      StrX::~StrX(&local_7c8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_7a8);
      errSeen = true;
    }
    actRetCanRep_7._4_4_ = st_Init;
    StrX::StrX(&local_7f8,data_rawstr_1 + 8);
    pXVar3 = StrX::unicodeForm(&local_7f8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar3,dt_integer,(Status *)((long)&actRetCanRep_7 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_7f8);
    local_7e8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_7._4_4_ != st_FOCA0002) {
        pXVar3 = getDataTypeString(dt_integer);
        StrX::StrX(&local_818,pXVar3);
        pcVar4 = StrX::localForm(&local_818);
        pcVar6 = getStatusString(st_FOCA0002);
        pcVar7 = getStatusString(actRetCanRep_7._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x5aa,data_rawstr_1 + 8,pcVar4,pcVar6,pcVar7);
        StrX::~StrX(&local_818);
        errSeen = true;
      }
    }
    else {
      pXVar3 = getDataTypeString(dt_integer);
      StrX::StrX(&local_808,pXVar3);
      StrX::localForm(&local_808);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x5aa,data_rawstr_1 + 8);
      StrX::~StrX(&local_808);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_7e8);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_integer()
{
    const XSValue::DataType dt = XSValue::dt_integer;
    bool  toValidate = true;

    const char lex_v_ran_v_1[]="   1234    \n";
    const char lex_v_ran64_v_1[]="+9223372036854775807";
    const char lex_v_ran64_v_2[]="-9223372036854775808";
    const char lex_v_ran64_iv_1[]="+9223372036854775808";
    const char lex_v_ran64_iv_2[]="-9223372036854775809";

    XSValue::XSValue_Data act_v_ran_v_1;   act_v_ran_v_1.fValue.f_long = (int64_t)1234ll;
    XSValue::XSValue_Data act_v_ran64_v_1; act_v_ran64_v_1.fValue.f_long = (int64_t)+9223372036854775807ll;
    XSValue::XSValue_Data act_v_ran64_v_2; act_v_ran64_v_2.fValue.f_long = (int64_t)-9223372036854775808ll;
    XSValue::XSValue_Data act_v_ran32_v_1; act_v_ran32_v_1.fValue.f_long = (int64_t)+2147483647ll;
    XSValue::XSValue_Data act_v_ran32_v_2; act_v_ran32_v_2.fValue.f_long = (int64_t)-2147483648ll;

    const char lex_v_ran64_v_1_canrep[]="9223372036854775807";
    const char lex_v_ran64_v_2_canrep[]="-9223372036854775808";
    const char lex_v_ran64_iv_1_canrep[]="9223372036854775808";
    const char lex_v_ran64_iv_2_canrep[]="-9223372036854775809";

    const char lex_iv_1[]="12b34.456";
    const char lex_iv_2[]="1234b56";

/***
 * 3.3.13.2 Canonical representation
 *
 * The canonical representation for integer is defined by prohibiting certain options from the Lexical
 * representation (3.3.13.1). Specifically,
 * 1. the preceding optional "+" sign is prohibited and
 * 2. leading zeroes are prohibited.
 *
 ***/

    const char data_rawstr_1[]="   +12345   \n";
    const char data_canrep_1[]="12345";
    const char data_rawstr_2[]="00012345";
    const char data_canrep_2[]="12345";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid       n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_ran_v_1    , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_1  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_v_2  , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran64_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        ACTVALUE_TEST(lex_v_ran_v_1,    dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);

        ACTVALUE_TEST(lex_v_ran64_v_1 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_v_2 , dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran64_v_2);
        ACTVALUE_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);
        ACTVALUE_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0003, act_v_ran64_v_1);

        ACTVALUE_TEST(lex_iv_1,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
        ACTVALUE_TEST(lex_iv_2,         dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran32_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh         n/a
     *          range  invalid          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j)? true : false;

        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    XSValue::st_FOCA0002);

        CANREP_TEST(lex_v_ran64_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_1_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_v_2_canrep,  DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_1, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_ran64_iv_2, dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran64_iv_2_canrep, DONT_CARE);
        CANREP_TEST(lex_iv_1        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2        , dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

    }

}